

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_adds_s_d_mips64el(CPUMIPSState_conflict10 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  float64 fVar1;
  float64 fVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  float64 fVar6;
  
  fVar1 = (env->active_fpu).fpr[ws].fd;
  fVar2 = (env->active_fpu).fpr[wt].fd;
  if ((long)fVar1 < 0) {
    fVar6 = 0x8000000000000000;
    if ((long)(-0x8000000000000000 - fVar1) < (long)fVar2) {
      fVar6 = fVar2 + fVar1;
    }
  }
  else {
    fVar6 = fVar2 + fVar1;
    if ((long)(0x7fffffffffffffff - fVar1) <= (long)fVar2) {
      fVar6 = 0x7fffffffffffffff;
    }
  }
  (env->active_fpu).fpr[wd].fd = fVar6;
  lVar3 = *(long *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
  lVar4 = *(long *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
  if (lVar3 < 0) {
    lVar5 = -0x8000000000000000;
    if (-0x8000000000000000 - lVar3 < lVar4) {
      lVar5 = lVar4 + lVar3;
    }
  }
  else {
    lVar5 = 0x7fffffffffffffff;
    if (lVar4 < 0x7fffffffffffffff - lVar3) {
      lVar5 = lVar4 + lVar3;
    }
  }
  *(long *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = lVar5;
  return;
}

Assistant:

void helper_msa_adds_s_d(CPUMIPSState *env,
                         uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->d[0]  = msa_adds_s_df(DF_DOUBLE, pws->d[0],  pwt->d[0]);
    pwd->d[1]  = msa_adds_s_df(DF_DOUBLE, pws->d[1],  pwt->d[1]);
}